

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

void __thiscall Palette::readSettings(Palette *this,QSettings *settings)

{
  bool bVar1;
  reference pvVar2;
  QColor QVar3;
  undefined8 local_b8;
  undefined4 local_b0;
  ushort uStack_ac;
  undefined1 local_94 [8];
  QColor color;
  QVariant local_78;
  QVariant local_58;
  undefined1 local_38 [8];
  QString colorstr;
  int i;
  QSettings *settings_local;
  Palette *this_local;
  
  QSettings::beginGroup((QString *)settings);
  colorstr.d.size._4_4_ = ColorBackground;
  do {
    if (0x19 < (int)colorstr.d.size._4_4_) {
      QSettings::endGroup();
      return;
    }
    std::array<QString,_26UL>::operator[]
              ((array<QString,_26UL> *)PaletteTU::ColorKeys,(long)(int)colorstr.d.size._4_4_);
    QVariant::QVariant(&local_78);
    QSettings::value((QString *)&local_58,(QVariant *)settings);
    QVariant::toString();
    QVariant::~QVariant(&local_58);
    QVariant::~QVariant(&local_78);
    bVar1 = QString::isEmpty((QString *)local_38);
    if (bVar1) {
LAB_0015a1b4:
      QVar3 = getDefault(colorstr.d.size._4_4_);
      local_b8 = QVar3._0_8_;
      local_b0 = QVar3.ct._4_4_;
      uStack_ac = QVar3.ct._8_2_;
      pvVar2 = std::array<QColor,_26UL>::operator[](&this->mData,(long)(int)colorstr.d.size._4_4_);
      *(undefined8 *)pvVar2 = local_b8;
      *(undefined4 *)((long)&pvVar2->ct + 4) = local_b0;
      (pvVar2->ct).argb.pad = uStack_ac;
    }
    else {
      QColor::QColor((QColor *)local_94,(QString *)local_38);
      bVar1 = QColor::isValid((QColor *)local_94);
      if (!bVar1) goto LAB_0015a1b4;
      QColor::setAlpha((int)local_94);
      pvVar2 = std::array<QColor,_26UL>::operator[](&this->mData,(long)(int)colorstr.d.size._4_4_);
      *(undefined1 (*) [8])pvVar2 = local_94;
      *(Spec *)((long)&pvVar2->ct + 4) = color.cspec;
      (pvVar2->ct).argb.pad = color.ct.argb.alpha;
    }
    QString::~QString((QString *)local_38);
    colorstr.d.size._4_4_ = colorstr.d.size._4_4_ + ColorBackgroundHighlight1;
  } while( true );
}

Assistant:

void Palette::readSettings(QSettings &settings) {

    settings.beginGroup(Keys::Palette);

    for (int i = 0; i < ColorCount; ++i) {

        auto colorstr = settings.value(TU::ColorKeys[i]).toString();
        if (!colorstr.isEmpty()) {
            QColor color(colorstr);
            if (color.isValid()) {
                color.setAlpha(255); // sanitize
                mData[i] = color;
                continue; // success, do not load default
            }
        }
        // setting not found or was invalid
        // load the default
        mData[i] = getDefault((Color)i);
    }

    settings.endGroup();
}